

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O2

void __thiscall avro::FixedSchema::FixedSchema(FixedSchema *this,int size,string *name)

{
  Node *pNVar1;
  Name local_60;
  
  pNVar1 = (Node *)operator_new(0x60);
  NodeFixed::NodeFixed((NodeFixed *)pNVar1);
  Schema::Schema(&this->super_Schema,pNVar1);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001eba30;
  Node::setFixedSize((this->super_Schema).node_.px,size);
  pNVar1 = (this->super_Schema).node_.px;
  Name::Name(&local_60,name);
  Node::setName(pNVar1,&local_60);
  Name::~Name(&local_60);
  return;
}

Assistant:

FixedSchema::FixedSchema(int size, const std::string &name) :
    Schema(new NodeFixed)
{
    node_->setFixedSize(size);
    node_->setName(name);
}